

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[28],char_const*,char[14],char_const*,char[23],std::__cxx11::string,char[38]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [28],char **Args_1,
          char (*Args_2) [14],char **Args_3,char (*Args_4) [23],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_5,
          char (*Args_6) [38])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [23];
  char **Args_local_3;
  char (*Args_local_2) [14];
  char **Args_local_1;
  char (*Args_local) [28];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[28],char_const*,char[14],char_const*,char[23],std::__cxx11::string,char[38]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [28])this,(char **)Args,(char (*) [14])Args_1,(char **)Args_2,
             (char (*) [23])Args_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_4,
             (char (*) [38])Args_5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}